

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

int __thiscall ncnn::Slice::load_param(Slice *this,ParamDict *pd)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  Mat local_c8;
  Mat local_78;
  
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,0,&local_78);
  if (&this->slices != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->slices).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->slices).data;
        pAVar3 = (this->slices).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->slices).cstep = 0;
    *(undefined8 *)((long)&(this->slices).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->slices).elemsize + 4) = 0;
    (this->slices).data = (void *)0x0;
    (this->slices).refcount = (int *)0x0;
    (this->slices).dims = 0;
    (this->slices).w = 0;
    (this->slices).h = 0;
    (this->slices).d = 0;
    (this->slices).c = 0;
    (this->slices).data = local_c8.data;
    (this->slices).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->slices).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->slices).elempack = local_c8.elempack;
    (this->slices).allocator = local_c8.allocator;
    (this->slices).dims = local_c8.dims;
    (this->slices).w = local_c8.w;
    (this->slices).h = local_c8.h;
    (this->slices).d = local_c8.d;
    (this->slices).c = local_c8.c;
    (this->slices).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  iVar4 = ParamDict::get(pd,1,0);
  this->axis = iVar4;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,2,&local_78);
  if (&this->indices != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->indices).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->indices).data;
        pAVar3 = (this->indices).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->indices).cstep = 0;
    *(undefined8 *)((long)&(this->indices).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->indices).elemsize + 4) = 0;
    (this->indices).data = (void *)0x0;
    (this->indices).refcount = (int *)0x0;
    (this->indices).dims = 0;
    (this->indices).w = 0;
    (this->indices).h = 0;
    (this->indices).d = 0;
    (this->indices).c = 0;
    (this->indices).data = local_c8.data;
    (this->indices).refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->indices).elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->indices).elempack = local_c8.elempack;
    (this->indices).allocator = local_c8.allocator;
    (this->indices).dims = local_c8.dims;
    (this->indices).w = local_c8.w;
    (this->indices).h = local_c8.h;
    (this->indices).d = local_c8.d;
    (this->indices).c = local_c8.c;
    (this->indices).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Slice::load_param(const ParamDict& pd)
{
    slices = pd.get(0, Mat());
    axis = pd.get(1, 0);
    indices = pd.get(2, Mat());

    return 0;
}